

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
          (CCheckQueueControl<FakeCheckCheckCompletion> *this,
          CCheckQueue<FakeCheckCheckCompletion> *pqueueIn)

{
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  *(undefined1 *)(in_RDI + 1) = 0;
  if (*in_RDI != 0) {
    EnterCritical<AnnotatedMixin<std::mutex>>
              (pszName,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20),
               (AnnotatedMixin<std::mutex> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
    AnnotatedMixin<std::mutex>::lock
              ((AnnotatedMixin<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueueControl(CCheckQueue<T> * const pqueueIn) : pqueue(pqueueIn), fDone(false)
    {
        // passed queue is supposed to be unused, or nullptr
        if (pqueue != nullptr) {
            ENTER_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }